

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-impl-ncurses.cpp
# Opt level: O2

void ImTui_ImplNcurses_DrawScreen(bool active)

{
  int *piVar1;
  int *piVar2;
  uint pnx;
  uint pny;
  uint uVar3;
  uint64_t uVar4;
  double dVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  VSync *pVVar11;
  long lVar12;
  uchar uVar13;
  int iVar14;
  undefined7 in_register_00000039;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  ulong uVar22;
  bool bVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  duration<long,_std::ratio<1L,_1000000L>_> local_38;
  ulong uVar21;
  
  if ((int)CONCAT71(in_register_00000039,active) != 0) {
    nActiveFrames = 10;
  }
  wrefresh(_stdscr);
  pnx = g_screen->nx;
  lVar12 = (long)(int)pnx;
  pny = g_screen->ny;
  bVar6 = screenPrev.ny == pny;
  bVar7 = screenPrev.nx == pnx;
  if (!bVar6 || !bVar7) {
    ImTui::TScreen::resize(&screenPrev,pnx,pny);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&curs,lVar12 + 1);
  lVar16 = 0;
  uVar8 = 0;
  if (0 < (int)pnx) {
    uVar8 = (ulong)pnx;
  }
  uVar9 = 0;
  if (0 < (int)pny) {
    uVar9 = (ulong)pny;
  }
  uVar15 = 0;
  iVar14 = 0;
  do {
    if (uVar15 == uVar9) {
      if (!bVar6 || !bVar7) {
        memcpy(screenPrev.data,g_screen->data,(long)(int)(pny * pnx) << 2);
      }
      iVar14 = nActiveFrames;
      nActiveFrames = nActiveFrames + -1;
      lVar12 = std::chrono::_V2::system_clock::now();
      pVVar11 = (VSync *)&g_vsync.tStepIdle_us;
      if (0 < iVar14) {
        pVVar11 = &g_vsync;
      }
      uVar4 = pVVar11->tStepActive_us;
      lVar16 = g_vsync.tNext_us + uVar4;
      lVar19 = g_vsync.tNext_us + uVar4;
      auVar25._8_4_ = (int)((ulong)lVar19 >> 0x20);
      auVar25._0_8_ = lVar19;
      auVar25._12_4_ = 0x45300000;
      do {
        uVar8 = lVar12 / 1000;
        if (lVar16 - 100U <= uVar8) {
          g_vsync.tNext_us = g_vsync.tNext_us + uVar4;
          return;
        }
        auVar26._8_4_ = (int)(uVar8 >> 0x20);
        auVar26._0_8_ = uVar8;
        auVar26._12_4_ = 0x45300000;
        auVar28._8_4_ = (int)(g_vsync.tStepActive_us >> 0x20);
        auVar28._0_8_ = g_vsync.tStepActive_us;
        auVar28._12_4_ = 0x45300000;
        dVar24 = (auVar28._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)g_vsync.tStepActive_us) - 4503599627370496.0);
        if (dVar24 * 0.5 +
            (auVar26._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0) <
            (auVar25._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar19) - 4503599627370496.0)) {
          iVar14 = wgetch(_stdscr);
          if (iVar14 != -1) {
            ungetch(iVar14);
            return;
          }
          dVar24 = ((double)CONCAT44(0x45300000,(int)(g_vsync.tStepActive_us >> 0x20)) -
                   1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)g_vsync.tStepActive_us) - 4503599627370496.0);
        }
        uVar9 = (ulong)(dVar24 * 0.9);
        lVar12 = lVar19 - uVar8;
        auVar27._8_4_ = (int)((ulong)lVar12 >> 0x20);
        auVar27._0_8_ = lVar12;
        auVar27._12_4_ = 0x45300000;
        dVar5 = ((auVar27._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0)) * 0.9;
        uVar8 = (ulong)dVar5;
        uVar9 = (long)(dVar24 * 0.9 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f | uVar9;
        local_38.__r = (long)(dVar5 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
        if (uVar9 <= (ulong)local_38.__r) {
          local_38.__r = uVar9;
        }
        std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>(&local_38);
        lVar12 = std::chrono::_V2::system_clock::now();
      } while( true );
    }
    lVar19 = lVar16;
    uVar17 = uVar8;
    if (bVar6 && bVar7) {
      do {
        if (uVar17 == 0) goto LAB_00105382;
        piVar1 = (int *)((long)screenPrev.data + lVar19);
        piVar2 = (int *)((long)g_screen->data + lVar19);
        lVar19 = lVar19 + 4;
        uVar17 = uVar17 - 1;
      } while (*piVar1 == *piVar2);
    }
    lVar18 = uVar15 * lVar12;
    move(uVar15,0);
    uVar17 = uVar8;
    lVar19 = lVar18;
    uVar22 = 0xffffffffffffffff;
    while( true ) {
      bVar23 = uVar17 == 0;
      uVar17 = uVar17 - 1;
      if (bVar23) break;
      uVar3 = g_screen->data[lVar19];
      uVar20 = uVar3 >> 0x10 & 0xff | (uVar3 >> 0x18) << 8;
      uVar21 = (ulong)uVar20;
      if (colPairs._M_elems[uVar21].first == false) {
        init_pair((int)(short)nColPairs,uVar3 >> 0x10 & 0xff);
        colPairs._M_elems[uVar21].first = true;
        colPairs._M_elems[uVar21].second = nColPairs;
        nColPairs = nColPairs + 1;
      }
      if ((uint)uVar22 == uVar20) {
        uVar21 = uVar22 & 0xffffffff;
      }
      else {
        if (curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
          curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[iVar14] = '\0';
          waddnstr(_stdscr,curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start,0xffffffffffffffff);
          iVar14 = 0;
          *curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start = '\0';
        }
        wattr_on(_stdscr,(colPairs._M_elems[uVar21].second & 0xffU) << 8,0);
      }
      uVar13 = (uchar)uVar3;
      if ((short)uVar3 == 0) {
        uVar13 = ' ';
      }
      lVar10 = (long)iVar14;
      iVar14 = iVar14 + 1;
      curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[lVar10] = uVar13;
      lVar19 = lVar19 + 1;
      uVar22 = uVar21;
    }
    if (curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[iVar14] = '\0';
      waddnstr(_stdscr,curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,0xffffffffffffffff);
      iVar14 = 0;
      *curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start = '\0';
    }
    if (bVar6 && bVar7) {
      memcpy(screenPrev.data + lVar18,g_screen->data + lVar18,lVar12 * 4);
    }
LAB_00105382:
    uVar15 = uVar15 + 1;
    lVar16 = lVar16 + lVar12 * 4;
  } while( true );
}

Assistant:

void ImTui_ImplNcurses_DrawScreen(bool active) {
    if (active) nActiveFrames = 10;

    wrefresh(stdscr);

    int nx = g_screen->nx;
    int ny = g_screen->ny;

    bool compare = true;

    if (screenPrev.nx != nx || screenPrev.ny != ny) {
        screenPrev.resize(nx, ny);
        compare = false;
    }

    int ic = 0;
    curs.resize(nx + 1);

    for (int y = 0; y < ny; ++y) {
        bool isSame = compare;
        if (compare) {
            for (int x = 0; x < nx; ++x) {
                if (screenPrev.data[y*nx + x] != g_screen->data[y*nx + x]) {
                    isSame = false;
                    break;
                }
            }
        }
        if (isSame) continue;

        int lastp = 0xFFFFFFFF;
        move(y, 0);
        for (int x = 0; x < nx; ++x) {
            const auto cell = g_screen->data[y*nx + x];
            const uint16_t f = (cell & 0x00FF0000) >> 16;
            const uint16_t b = (cell & 0xFF000000) >> 24;
            const uint16_t p = b*256 + f;

            if (colPairs[p].first == false) {
                init_pair(nColPairs, f, b);
                colPairs[p].first = true;
                colPairs[p].second = nColPairs;
                ++nColPairs;
            }

            if (lastp != (int) p) {
                if (curs.size() > 0) {
                    curs[ic] = 0;
                    addstr((char *) curs.data());
                    ic = 0;
                    curs[0] = 0;
                }
                attron(COLOR_PAIR(colPairs[p].second));
                lastp = p;
            }

            const uint16_t c = cell & 0x0000FFFF;
            curs[ic++] = c > 0 ? c : ' ';
        }

        if (curs.size() > 0) {
            curs[ic] = 0;
            addstr((char *) curs.data());
            ic = 0;
            curs[0] = 0;
        }

        if (compare) {
            memcpy(screenPrev.data + y*nx, g_screen->data + y*nx, nx*sizeof(ImTui::TCell));
        }
    }

    if (!compare) {
        memcpy(screenPrev.data, g_screen->data, nx*ny*sizeof(ImTui::TCell));
    }

    g_vsync.wait(nActiveFrames --> 0);
}